

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssl_credential.cc
# Opt level: O0

int SSL_CREDENTIAL_set1_delegated_credential(SSL_CREDENTIAL *cred,CRYPTO_BUFFER *dc)

{
  bool bVar1;
  int iVar2;
  size_t sVar3;
  EVP_PKEY *__p;
  pointer pubkey_00;
  pointer privkey;
  unique_ptr<crypto_buffer_st,_bssl::internal::Deleter> local_98;
  Span<unsigned_short> local_90;
  Span<const_unsigned_short> local_80;
  undefined4 local_70;
  unique_ptr<evp_pkey_st,_bssl::internal::Deleter> local_60;
  UniquePtr<EVP_PKEY> pubkey;
  uint16_t algorithm;
  uint16_t dc_cert_verify_algorithm;
  uint32_t valid_time;
  CBS sig;
  CBS spki;
  CBS cbs;
  CRYPTO_BUFFER *dc_local;
  SSL_CREDENTIAL *cred_local;
  
  if (cred->type != kDelegated) {
    ERR_put_error(0x10,0,0x42,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_credential.cc"
                  ,0x191);
    return 0;
  }
  CRYPTO_BUFFER_init_CBS(dc,(CBS *)&spki.len);
  iVar2 = CBS_get_u32((CBS *)&spki.len,
                      (uint32_t *)
                      ((long)&pubkey._M_t.
                              super___uniq_ptr_impl<evp_pkey_st,_bssl::internal::Deleter>._M_t.
                              super__Tuple_impl<0UL,_evp_pkey_st_*,_bssl::internal::Deleter>.
                              super__Head_base<0UL,_evp_pkey_st_*,_false>._M_head_impl + 4));
  if (((((iVar2 == 0) ||
        (iVar2 = CBS_get_u16((CBS *)&spki.len,
                             (uint16_t *)
                             ((long)&pubkey._M_t.
                                     super___uniq_ptr_impl<evp_pkey_st,_bssl::internal::Deleter>.
                                     _M_t.
                                     super__Tuple_impl<0UL,_evp_pkey_st_*,_bssl::internal::Deleter>.
                                     super__Head_base<0UL,_evp_pkey_st_*,_false>._M_head_impl + 2)),
        iVar2 == 0)) ||
       (iVar2 = CBS_get_u24_length_prefixed((CBS *)&spki.len,(CBS *)&sig.len), iVar2 == 0)) ||
      ((iVar2 = CBS_get_u16((CBS *)&spki.len,(uint16_t *)&pubkey), iVar2 == 0 ||
       (iVar2 = CBS_get_u16_length_prefixed((CBS *)&spki.len,(CBS *)&algorithm), iVar2 == 0)))) ||
     ((sVar3 = CBS_len((CBS *)&algorithm), sVar3 == 0 ||
      (sVar3 = CBS_len((CBS *)&spki.len), sVar3 != 0)))) {
    ERR_put_error(0x10,0,0x89,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_credential.cc"
                  ,0x1a2);
    return 0;
  }
  iVar2 = SSL_get_signature_algorithm_key_type
                    (pubkey._M_t.super___uniq_ptr_impl<evp_pkey_st,_bssl::internal::Deleter>._M_t.
                     super__Tuple_impl<0UL,_evp_pkey_st_*,_bssl::internal::Deleter>.
                     super__Head_base<0UL,_evp_pkey_st_*,_false>._M_head_impl._2_2_);
  if (iVar2 == 6) {
    ERR_put_error(0x10,0,0x127,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_credential.cc"
                  ,0x1ab);
    return 0;
  }
  __p = EVP_parse_public_key((CBS *)&sig.len);
  std::unique_ptr<evp_pkey_st,bssl::internal::Deleter>::unique_ptr<bssl::internal::Deleter,void>
            ((unique_ptr<evp_pkey_st,bssl::internal::Deleter> *)&local_60,__p);
  bVar1 = std::operator==(&local_60,(nullptr_t)0x0);
  if ((bVar1) || (sVar3 = CBS_len((CBS *)&sig.len), sVar3 != 0)) {
    ERR_put_error(0x10,0,0x89,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_credential.cc"
                  ,0x1b1);
    cred_local._4_4_ = 0;
  }
  else {
    bssl::Span<unsigned_short>::Span
              (&local_90,
               (unsigned_short *)
               ((long)&pubkey._M_t.super___uniq_ptr_impl<evp_pkey_st,_bssl::internal::Deleter>._M_t.
                       super__Tuple_impl<0UL,_evp_pkey_st_*,_bssl::internal::Deleter>.
                       super__Head_base<0UL,_evp_pkey_st_*,_false>._M_head_impl + 2),1);
    bssl::Span<unsigned_short_const>::
    Span<bssl::Span<unsigned_short>,void,bssl::Span<unsigned_short>>
              ((Span<unsigned_short_const> *)&local_80,&local_90);
    bVar1 = bssl::Array<unsigned_short>::CopyFrom(&cred->sigalgs,local_80);
    if (((bVar1 ^ 0xffU) & 1) == 0) {
      bVar1 = std::operator!=(&cred->privkey,(nullptr_t)0x0);
      if (bVar1) {
        pubkey_00 = std::unique_ptr<evp_pkey_st,_bssl::internal::Deleter>::get(&local_60);
        privkey = std::unique_ptr<evp_pkey_st,_bssl::internal::Deleter>::get(&cred->privkey);
        bVar1 = bssl::ssl_compare_public_and_private_key(pubkey_00,privkey);
        if (!bVar1) {
          cred_local._4_4_ = 0;
          goto LAB_003720c9;
        }
      }
      bssl::UpRef((bssl *)&local_98,dc);
      std::unique_ptr<crypto_buffer_st,_bssl::internal::Deleter>::operator=(&cred->dc,&local_98);
      std::unique_ptr<crypto_buffer_st,_bssl::internal::Deleter>::~unique_ptr(&local_98);
      std::unique_ptr<evp_pkey_st,_bssl::internal::Deleter>::operator=(&cred->pubkey,&local_60);
      cred->dc_algorithm =
           (uint16_t)
           pubkey._M_t.super___uniq_ptr_impl<evp_pkey_st,_bssl::internal::Deleter>._M_t.
           super__Tuple_impl<0UL,_evp_pkey_st_*,_bssl::internal::Deleter>.
           super__Head_base<0UL,_evp_pkey_st_*,_false>._M_head_impl;
      cred_local._4_4_ = 1;
    }
    else {
      cred_local._4_4_ = 0;
    }
  }
LAB_003720c9:
  local_70 = 1;
  std::unique_ptr<evp_pkey_st,_bssl::internal::Deleter>::~unique_ptr(&local_60);
  return cred_local._4_4_;
}

Assistant:

int SSL_CREDENTIAL_set1_delegated_credential(SSL_CREDENTIAL *cred,
                                             CRYPTO_BUFFER *dc) {
  if (cred->type != SSLCredentialType::kDelegated) {
    OPENSSL_PUT_ERROR(SSL, ERR_R_SHOULD_NOT_HAVE_BEEN_CALLED);
    return 0;
  }

  // Parse the delegated credential to check for validity, and extract a few
  // fields from it. See RFC 9345, section 4.
  CBS cbs, spki, sig;
  uint32_t valid_time;
  uint16_t dc_cert_verify_algorithm, algorithm;
  CRYPTO_BUFFER_init_CBS(dc, &cbs);
  if (!CBS_get_u32(&cbs, &valid_time) ||
      !CBS_get_u16(&cbs, &dc_cert_verify_algorithm) ||
      !CBS_get_u24_length_prefixed(&cbs, &spki) ||
      !CBS_get_u16(&cbs, &algorithm) ||
      !CBS_get_u16_length_prefixed(&cbs, &sig) ||  //
      CBS_len(&sig) == 0 ||                        //
      CBS_len(&cbs) != 0) {
    OPENSSL_PUT_ERROR(SSL, SSL_R_DECODE_ERROR);
    return 0;
  }

  // RFC 9345 forbids algorithms that use the rsaEncryption OID. As the
  // RSASSA-PSS OID is unusably complicated, this effectively means we will not
  // support RSA delegated credentials.
  if (SSL_get_signature_algorithm_key_type(dc_cert_verify_algorithm) ==
      EVP_PKEY_RSA) {
    OPENSSL_PUT_ERROR(SSL, SSL_R_INVALID_SIGNATURE_ALGORITHM);
    return 0;
  }

  UniquePtr<EVP_PKEY> pubkey(EVP_parse_public_key(&spki));
  if (pubkey == nullptr || CBS_len(&spki) != 0) {
    OPENSSL_PUT_ERROR(SSL, SSL_R_DECODE_ERROR);
    return 0;
  }

  if (!cred->sigalgs.CopyFrom(Span(&dc_cert_verify_algorithm, 1))) {
    return 0;
  }

  if (cred->privkey != nullptr &&
      !ssl_compare_public_and_private_key(pubkey.get(), cred->privkey.get())) {
    return 0;
  }

  cred->dc = UpRef(dc);
  cred->pubkey = std::move(pubkey);
  cred->dc_algorithm = algorithm;
  return 1;
}